

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool wabt::anon_unknown_1::IsInstr(TokenTypePair pair)

{
  bool bVar1;
  
  bVar1 = IsPlainOrBlockInstr(pair._M_elems[0]);
  if (bVar1) {
    return true;
  }
  bVar1 = IsExpr(pair);
  return bVar1;
}

Assistant:

bool IsInstr(TokenTypePair pair) {
  return IsPlainOrBlockInstr(pair[0]) || IsExpr(pair);
}